

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O3

void do_value(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  bool bVar2;
  CHAR_DATA *ch_00;
  OBJ_DATA *obj;
  char *pcVar3;
  float fVar4;
  char arg [4608];
  char buf [4608];
  char local_2428 [4608];
  char local_1228 [4616];
  
  one_argument(argument,local_2428);
  if (local_2428[0] == '\0') {
    pcVar3 = "Value what?\n\r";
LAB_00260d14:
    send_to_char(pcVar3,ch);
  }
  else {
    ch_00 = find_keeper(ch);
    if (ch_00 == (CHAR_DATA *)0x0) {
      return;
    }
    obj = get_obj_carry(ch,local_2428,ch);
    if (obj == (OBJ_DATA *)0x0) {
      pcVar3 = "$n tells you \'You don\'t have that item\'.";
      obj = (OBJ_DATA *)0x0;
LAB_00260d2a:
      act(pcVar3,ch_00,obj,ch,2);
      ch->reply = ch_00;
      return;
    }
    bVar2 = can_see_obj(ch_00,obj);
    if (bVar2) {
      bVar2 = can_drop_obj(ch,obj);
      if (!bVar2) {
        pcVar3 = "You can\'t let go of it.\n\r";
        goto LAB_00260d14;
      }
      if (ch_00->pIndexData->pShop != (SHOP_DATA *)0x0) {
        iVar1 = obj->cost;
        fVar4 = calculate_inflation();
        fVar4 = floorf(fVar4 * (float)iVar1);
        if (0 < (int)(long)fVar4) {
          pcVar3 = local_1228;
          sprintf(pcVar3,"$n tells you \'I\'ll give you %d gold coins for $p.\'",
                  ((long)fVar4 & 0xffffffffU) / 100);
          goto LAB_00260d2a;
        }
      }
      pcVar3 = "$n looks uninterested in $p.";
    }
    else {
      pcVar3 = "$n doesn\'t see what you are offering.";
      obj = (OBJ_DATA *)0x0;
    }
    act(pcVar3,ch_00,obj,ch,2);
  }
  return;
}

Assistant:

void do_value(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char arg[MAX_INPUT_LENGTH];
	CHAR_DATA *keeper;
	OBJ_DATA *obj;
	int cost;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Value what?\n\r", ch);
		return;
	}

	keeper = find_keeper(ch);

	if (keeper == nullptr)
		return;

	obj = get_obj_carry(ch, arg, ch);

	if (obj == nullptr)
	{
		act("$n tells you 'You don't have that item'.", keeper, nullptr, ch, TO_VICT);
		ch->reply = keeper;
		return;
	}

	if (!can_see_obj(keeper, obj))
	{
		act("$n doesn't see what you are offering.", keeper, nullptr, ch, TO_VICT);
		return;
	}

	if (!can_drop_obj(ch, obj))
	{
		send_to_char("You can't let go of it.\n\r", ch);
		return;
	}

	cost = get_cost(keeper, obj, false);

	if (cost <= 0)
	{
		act("$n looks uninterested in $p.", keeper, obj, ch, TO_VICT);
		return;
	}

	sprintf(buf, "$n tells you 'I'll give you %d gold coins for $p.'", cost / 100);
	act(buf, keeper, obj, ch, TO_VICT);

	ch->reply = keeper;
}